

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralPointReaction,_0UL>::
         Construct(DB *db,LIST *params)

{
  IfcStructuralPointReaction *in;
  
  in = (IfcStructuralPointReaction *)operator_new(0x170);
  *(undefined ***)&(in->super_IfcStructuralReaction).field_0x158 = &PTR__Object_00836880;
  *(undefined8 *)&in->field_0x160 = 0;
  *(char **)&in->field_0x168 = "IfcStructuralPointReaction";
  Assimp::IFC::Schema_2x3::IfcStructuralReaction::IfcStructuralReaction
            ((IfcStructuralReaction *)in,&PTR_construction_vtable_24__008b2d78);
  *(undefined ***)
   &(in->super_IfcStructuralReaction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject =
       &PTR__IfcStructuralPointReaction_008b2c48;
  *(undefined ***)&(in->super_IfcStructuralReaction).field_0x158 =
       &PTR__IfcStructuralPointReaction_008b2d60;
  *(undefined ***)
   &(in->super_IfcStructuralReaction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x88 = &PTR__IfcStructuralPointReaction_008b2c70;
  (in->super_IfcStructuralReaction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcStructuralPointReaction_008b2c98;
  *(undefined ***)
   &(in->super_IfcStructuralReaction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xd0 = &PTR__IfcStructuralPointReaction_008b2cc0;
  *(undefined ***)
   &(in->super_IfcStructuralReaction).super_IfcStructuralActivity.super_IfcProduct.field_0x100 =
       &PTR__IfcStructuralPointReaction_008b2ce8;
  *(undefined ***)&(in->super_IfcStructuralReaction).super_IfcStructuralActivity.field_0x138 =
       &PTR__IfcStructuralPointReaction_008b2d10;
  *(undefined ***)&(in->super_IfcStructuralReaction).super_IfcStructuralActivity.field_0x148 =
       &PTR__IfcStructuralPointReaction_008b2d38;
  GenericFill<Assimp::IFC::Schema_2x3::IfcStructuralPointReaction>(db,params,in);
  return (Object *)
         (&(in->super_IfcStructuralReaction).super_IfcStructuralActivity.super_IfcProduct.
           super_IfcObject.field_0x0 +
         *(long *)(*(long *)&(in->super_IfcStructuralReaction).super_IfcStructuralActivity.
                             super_IfcProduct.super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }